

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_result ma_audio_buffer_alloc_and_init
                    (ma_audio_buffer_config *pConfig,ma_audio_buffer **ppAudioBuffer)

{
  undefined1 *__src;
  ma_result mVar1;
  ma_audio_buffer *pAudioBuffer;
  ma_uint8 *p;
  ma_audio_buffer_config innerConfig;
  
  mVar1 = MA_INVALID_ARGS;
  if ((ppAudioBuffer != (ma_audio_buffer **)0x0) &&
     (*ppAudioBuffer = (ma_audio_buffer *)0x0, pConfig != (ma_audio_buffer_config *)0x0)) {
    innerConfig.format = pConfig->format;
    innerConfig.channels = pConfig->channels;
    innerConfig.sampleRate = pConfig->sampleRate;
    innerConfig._12_4_ = *(undefined4 *)&pConfig->field_0xc;
    innerConfig.sizeInFrames = pConfig->sizeInFrames;
    innerConfig.pData = pConfig->pData;
    innerConfig.allocationCallbacks.pUserData = (pConfig->allocationCallbacks).pUserData;
    innerConfig.allocationCallbacks.onMalloc = (pConfig->allocationCallbacks).onMalloc;
    innerConfig.allocationCallbacks.onRealloc = (pConfig->allocationCallbacks).onRealloc;
    innerConfig.allocationCallbacks.onFree = (pConfig->allocationCallbacks).onFree;
    ma_allocation_callbacks_init_copy
              (&innerConfig.allocationCallbacks,&pConfig->allocationCallbacks);
    mVar1 = MA_OUT_OF_MEMORY;
    if (innerConfig.allocationCallbacks.onMalloc != (_func_void_ptr_size_t_void_ptr *)0x0) {
      pAudioBuffer = (ma_audio_buffer *)
                     (*innerConfig.allocationCallbacks.onMalloc)
                               ((ulong)(pConfig->channels *
                                       *(int *)(&DAT_001908a0 + (ulong)pConfig->format * 4)) *
                                pConfig->sizeInFrames + 0x97,
                                innerConfig.allocationCallbacks.pUserData);
      if (pAudioBuffer != (ma_audio_buffer *)0x0) {
        __src = (undefined1 *)pConfig->pData;
        p = pAudioBuffer->_pExtraData;
        if (__src == (undefined1 *)0x0) {
          ma_silence_pcm_frames(p,pConfig->sizeInFrames,pConfig->format,pConfig->channels);
        }
        else if (p != __src) {
          memcpy(p,__src,(ulong)(*(int *)(&DAT_001908a0 + (ulong)pConfig->format * 4) *
                                pConfig->channels) * pConfig->sizeInFrames);
        }
        innerConfig.pData = p;
        mVar1 = ma_audio_buffer_init_ex(&innerConfig,0,pAudioBuffer);
        if (mVar1 == MA_SUCCESS) {
          *ppAudioBuffer = pAudioBuffer;
          mVar1 = MA_SUCCESS;
        }
        else if (innerConfig.allocationCallbacks.onFree != (_func_void_void_ptr_void_ptr *)0x0) {
          (*innerConfig.allocationCallbacks.onFree)
                    (pAudioBuffer,innerConfig.allocationCallbacks.pUserData);
        }
      }
    }
  }
  return mVar1;
}

Assistant:

MA_API ma_result ma_audio_buffer_alloc_and_init(const ma_audio_buffer_config* pConfig, ma_audio_buffer** ppAudioBuffer)
{
    ma_result result;
    ma_audio_buffer* pAudioBuffer;
    ma_audio_buffer_config innerConfig; /* We'll be making some changes to the config, so need to make a copy. */
    ma_uint64 allocationSizeInBytes;

    if (ppAudioBuffer == NULL) {
        return MA_INVALID_ARGS;
    }

    *ppAudioBuffer = NULL;  /* Safety. */

    if (pConfig == NULL) {
        return MA_INVALID_ARGS;
    }

    innerConfig = *pConfig;
    ma_allocation_callbacks_init_copy(&innerConfig.allocationCallbacks, &pConfig->allocationCallbacks);

    allocationSizeInBytes = sizeof(*pAudioBuffer) - sizeof(pAudioBuffer->_pExtraData) + (pConfig->sizeInFrames * ma_get_bytes_per_frame(pConfig->format, pConfig->channels));
    if (allocationSizeInBytes > MA_SIZE_MAX) {
        return MA_OUT_OF_MEMORY;    /* Too big. */
    }

    pAudioBuffer = (ma_audio_buffer*)ma_malloc((size_t)allocationSizeInBytes, &innerConfig.allocationCallbacks);  /* Safe cast to size_t. */
    if (pAudioBuffer == NULL) {
        return MA_OUT_OF_MEMORY;
    }

    if (pConfig->pData != NULL) {
        ma_copy_pcm_frames(&pAudioBuffer->_pExtraData[0], pConfig->pData, pConfig->sizeInFrames, pConfig->format, pConfig->channels);
    } else {
        ma_silence_pcm_frames(&pAudioBuffer->_pExtraData[0], pConfig->sizeInFrames, pConfig->format, pConfig->channels);
    }

    innerConfig.pData = &pAudioBuffer->_pExtraData[0];

    result = ma_audio_buffer_init_ex(&innerConfig, MA_FALSE, pAudioBuffer);
    if (result != MA_SUCCESS) {
        ma_free(pAudioBuffer, &innerConfig.allocationCallbacks);
        return result;
    }

    *ppAudioBuffer = pAudioBuffer;

    return MA_SUCCESS;
}